

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O3

void __thiscall
flatbuffers::cpp::CppGenerator::GenTablePost(CppGenerator *this,StructDef *struct_def)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  BaseType BVar3;
  Namespace *this_00;
  StructDef *pSVar4;
  CppGenerator *pCVar5;
  mapped_type *pmVar6;
  long *plVar7;
  undefined8 *puVar8;
  pointer ppFVar9;
  const_iterator cVar10;
  size_type *psVar11;
  FieldDef *union_field;
  ulong *puVar12;
  FieldDef *pFVar13;
  pointer ppFVar14;
  undefined8 uVar15;
  _Alloc_hider _Var16;
  bool bVar17;
  string qualified_create_name;
  string local_4f0;
  CodeWriter *local_4d0;
  key_type local_4c8;
  string local_4a8;
  CppGenerator *local_488;
  string local_480;
  IDLOptions *local_460;
  string local_458;
  StructDef *local_438;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->opts_).super_IDLOptions.generate_object_based_api == true) {
    GenNativeTablePost(this,struct_def);
  }
  paVar1 = &local_4c8.field_2;
  local_4c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"STRUCT_NAME","");
  EscapeKeyword(&local_4f0,this,(string *)struct_def);
  local_4d0 = &this->code_;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&local_4d0->value_map_,&local_4c8);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  local_4c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"NATIVE_NAME","");
  EscapeKeyword(&local_4a8,this,(string *)struct_def);
  local_460 = &(this->opts_).super_IDLOptions;
  NativeName(&local_4f0,&local_4a8,struct_def,local_460);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&local_4d0->value_map_,&local_4c8);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  if ((this->opts_).super_IDLOptions.generate_object_based_api != true) {
    return;
  }
  GenCopyCtorAssignOpDefs(this,struct_def);
  TableUnPackSignature_abi_cxx11_(&local_4f0,this,struct_def,false,local_460);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_4f0,0,(char *)0x0,0x361ffa);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_4c8.field_2._M_allocated_capacity = *psVar11;
    local_4c8.field_2._8_8_ = plVar7[3];
    local_4c8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_4c8.field_2._M_allocated_capacity = *psVar11;
    local_4c8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_4c8._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_4c8);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_330.field_2._M_allocated_capacity = *psVar11;
    local_330.field_2._8_8_ = plVar7[3];
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  }
  else {
    local_330.field_2._M_allocated_capacity = *psVar11;
    local_330._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_330._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  CodeWriter::operator+=(local_4d0,&local_330);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_4f0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  iVar2 = *(int *)&(this->opts_).super_IDLOptions.field_0x30c;
  if (iVar2 == 1) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               "  auto _o = std::unique_ptr<{{NATIVE_NAME}}>(new {{NATIVE_NAME}}());","");
    CodeWriter::operator+=(local_4d0,&local_50);
    _Var16._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_0016d24e;
  }
  else if (iVar2 == 0) {
    WrapNativeNameInNameSpace_abi_cxx11_
              (&local_4c8,this,struct_def,&((this->super_BaseGenerator).parser_)->opts);
    local_4f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"POINTER_TYPE","");
    GenTypeNativePtr(&local_4a8,this,&local_4c8,(FieldDef *)0x0,false);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&local_4d0->value_map_,&local_4f0);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
    }
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_250,
               "  {{POINTER_TYPE}} _o = {{POINTER_TYPE}}(new {{NATIVE_NAME}}());","");
    CodeWriter::operator+=(local_4d0,&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    local_50.field_2._M_allocated_capacity = local_4c8.field_2._M_allocated_capacity;
    _Var16._M_p = local_4c8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
LAB_0016d24e:
      operator_delete(_Var16._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"  auto _o = std::make_unique<{{NATIVE_NAME}}>();","");
    CodeWriter::operator+=(local_4d0,&local_70);
    local_50.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
    _Var16._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) goto LAB_0016d24e;
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"  UnPackTo(_o.get(), _resolver);","");
  CodeWriter::operator+=(local_4d0,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"  return _o.release();","");
  CodeWriter::operator+=(local_4d0,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"}","");
  CodeWriter::operator+=(local_4d0,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
  CodeWriter::operator+=(local_4d0,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  TableUnPackToSignature_abi_cxx11_(&local_4f0,this,struct_def,false,local_460);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_4f0,0,(char *)0x0,0x361ffa);
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_4c8.field_2._M_allocated_capacity = *psVar11;
    local_4c8.field_2._8_8_ = plVar7[3];
  }
  else {
    local_4c8.field_2._M_allocated_capacity = *psVar11;
    local_4c8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_4c8._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_4c8);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_350.field_2._M_allocated_capacity = *psVar11;
    local_350.field_2._8_8_ = plVar7[3];
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  }
  else {
    local_350.field_2._M_allocated_capacity = *psVar11;
    local_350._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_350._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  CodeWriter::operator+=(local_4d0,&local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"  (void)_o;","");
  CodeWriter::operator+=(local_4d0,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"  (void)_resolver;","");
  CodeWriter::operator+=(local_4d0,&local_130);
  local_488 = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  pCVar5 = local_488;
  ppFVar14 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppFVar9 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_438 = struct_def;
  if (ppFVar14 != ppFVar9) {
    do {
      pFVar13 = *ppFVar14;
      if (pFVar13->deprecated == false) {
        if ((pFVar13->value).type.base_type == BASE_TYPE_UTYPE) {
          union_field = ppFVar14[1];
        }
        else {
          union_field = (FieldDef *)0x0;
        }
        GenUnpackFieldStatement_abi_cxx11_(&local_4c8,pCVar5,pFVar13,union_field);
        local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"FIELD_NAME","");
        Name_abi_cxx11_(&local_4a8,pCVar5,pFVar13);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&local_4d0->value_map_,&local_4f0);
        std::__cxx11::string::_M_assign((string *)pmVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
          operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
          operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
        }
        local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_480,"  { auto _e = {{FIELD_NAME}}(); ","");
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_480);
        psVar11 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_4a8.field_2._M_allocated_capacity = *psVar11;
          local_4a8.field_2._8_8_ = plVar7[3];
          local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
        }
        else {
          local_4a8.field_2._M_allocated_capacity = *psVar11;
          local_4a8._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_4a8._M_string_length = plVar7[1];
        *plVar7 = (long)psVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_4a8,(ulong)local_4c8._M_dataplus._M_p);
        local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
        psVar11 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_4f0.field_2._M_allocated_capacity = *psVar11;
          local_4f0.field_2._8_8_ = plVar7[3];
        }
        else {
          local_4f0.field_2._M_allocated_capacity = *psVar11;
          local_4f0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_4f0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_4f0);
        psVar11 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_3d0.field_2._M_allocated_capacity = *psVar11;
          local_3d0.field_2._8_8_ = plVar7[3];
          local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
        }
        else {
          local_3d0.field_2._M_allocated_capacity = *psVar11;
          local_3d0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_3d0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        CodeWriter::operator+=(local_4d0,&local_3d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
          operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
          operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
          operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_dataplus._M_p != &local_480.field_2) {
          operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
          operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
        }
        ppFVar9 = (local_438->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppFVar14 = ppFVar14 + 1;
    } while (ppFVar14 != ppFVar9);
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"}","");
  CodeWriter::operator+=(local_4d0,&local_150);
  pCVar5 = local_488;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"");
  CodeWriter::operator+=(local_4d0,&local_170);
  pSVar4 = local_438;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  TablePackSignature_abi_cxx11_(&local_4f0,pCVar5,pSVar4,false,local_460);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_4f0,0,(char *)0x0,0x361ffa);
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_4c8.field_2._M_allocated_capacity = *psVar11;
    local_4c8.field_2._8_8_ = plVar7[3];
  }
  else {
    local_4c8.field_2._M_allocated_capacity = *psVar11;
    local_4c8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_4c8._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_4c8);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_370.field_2._M_allocated_capacity = *psVar11;
    local_370.field_2._8_8_ = plVar7[3];
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  }
  else {
    local_370.field_2._M_allocated_capacity = *psVar11;
    local_370._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_370._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  CodeWriter::operator+=(local_4d0,&local_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,"  return Create{{STRUCT_NAME}}(_fbb, _o, _rehasher);","");
  CodeWriter::operator+=(local_4d0,&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"}","");
  CodeWriter::operator+=(local_4d0,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
  CodeWriter::operator+=(local_4d0,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  TableCreateSignature_abi_cxx11_(&local_4f0,pCVar5,pSVar4,false,local_460);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_4f0,0,(char *)0x0,0x361ffa);
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_4c8.field_2._M_allocated_capacity = *psVar11;
    local_4c8.field_2._8_8_ = plVar7[3];
  }
  else {
    local_4c8.field_2._M_allocated_capacity = *psVar11;
    local_4c8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_4c8._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_4c8);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_390.field_2._M_allocated_capacity = *psVar11;
    local_390.field_2._8_8_ = plVar7[3];
    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  }
  else {
    local_390.field_2._M_allocated_capacity = *psVar11;
    local_390._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_390._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  CodeWriter::operator+=(local_4d0,&local_390);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"  (void)_rehasher;","");
  CodeWriter::operator+=(local_4d0,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"  (void)_o;","");
  CodeWriter::operator+=(local_4d0,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  GetBuilder_abi_cxx11_(&local_480,pCVar5);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_480,0,(char *)0x0,0x36218f);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_4a8.field_2._M_allocated_capacity = *psVar11;
    local_4a8.field_2._8_8_ = plVar7[3];
    local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  }
  else {
    local_4a8.field_2._M_allocated_capacity = *psVar11;
    local_4a8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_4a8._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_4a8);
  puVar12 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar12) {
    local_4f0.field_2._M_allocated_capacity = *puVar12;
    local_4f0.field_2._8_8_ = plVar7[3];
    local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  }
  else {
    local_4f0.field_2._M_allocated_capacity = *puVar12;
    local_4f0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_4f0._M_string_length = plVar7[1];
  *plVar7 = (long)puVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  EscapeKeyword(&local_230,pCVar5,(string *)pSVar4);
  NativeName(&local_458,&local_230,pSVar4,local_460);
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    uVar15 = local_4f0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_458._M_string_length + local_4f0._M_string_length) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      uVar15 = local_458.field_2._M_allocated_capacity;
    }
    if (local_458._M_string_length + local_4f0._M_string_length <= (ulong)uVar15) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_458,0,(char *)0x0,(ulong)local_4f0._M_dataplus._M_p);
      goto LAB_0016debe;
    }
  }
  puVar8 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_4f0,(ulong)local_458._M_dataplus._M_p);
LAB_0016debe:
  psVar11 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_4c8.field_2._M_allocated_capacity = *psVar11;
    local_4c8.field_2._8_8_ = puVar8[3];
    local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  }
  else {
    local_4c8.field_2._M_allocated_capacity = *psVar11;
    local_4c8._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_4c8._M_string_length = puVar8[1];
  *puVar8 = psVar11;
  puVar8[1] = 0;
  *(undefined1 *)psVar11 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_4c8);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_3b0.field_2._M_allocated_capacity = *psVar11;
    local_3b0.field_2._8_8_ = plVar7[3];
    local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  }
  else {
    local_3b0.field_2._M_allocated_capacity = *psVar11;
    local_3b0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_3b0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  CodeWriter::operator+=(local_4d0,&local_3b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_4f0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  ppFVar14 = (pSVar4->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppFVar9 = (pSVar4->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar14 != ppFVar9) {
    do {
      pFVar13 = *ppFVar14;
      if (pFVar13->deprecated == false) {
        BVar3 = (pFVar13->value).type.base_type;
        if ((BVar3 == BASE_TYPE_VECTOR64) || (BVar3 == BASE_TYPE_VECTOR)) {
          Name_abi_cxx11_(&local_480,local_488,pFVar13);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_480,0,(char *)0x0,0x362484);
          local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
          psVar11 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_4a8.field_2._M_allocated_capacity = *psVar11;
            local_4a8.field_2._8_8_ = plVar7[3];
          }
          else {
            local_4a8.field_2._M_allocated_capacity = *psVar11;
            local_4a8._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_4a8._M_string_length = plVar7[1];
          *plVar7 = (long)psVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_4a8);
          puVar12 = (ulong *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_4f0.field_2._M_allocated_capacity = *puVar12;
            local_4f0.field_2._8_8_ = plVar7[3];
            local_4f0._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_4f0.field_2._M_allocated_capacity = *puVar12;
            local_4f0._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_4f0._M_string_length = plVar7[1];
          *plVar7 = (long)puVar12;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          GenVectorForceAlign(&local_4c8,local_488,pFVar13,&local_4f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f0._M_dataplus._M_p != paVar1) {
            operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
            operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_dataplus._M_p != &local_480.field_2) {
            operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
          }
          if (local_4c8._M_string_length != 0) {
            std::operator+(&local_270,"  ",&local_4c8);
            CodeWriter::operator+=(local_4d0,&local_270);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_dataplus._M_p != &local_270.field_2) {
              operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
            operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
          }
        }
        Name_abi_cxx11_(&local_480,local_488,pFVar13);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_480,0,(char *)0x0,0x362220);
        local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
        psVar11 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_4a8.field_2._M_allocated_capacity = *psVar11;
          local_4a8.field_2._8_8_ = plVar7[3];
        }
        else {
          local_4a8.field_2._M_allocated_capacity = *psVar11;
          local_4a8._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_4a8._M_string_length = plVar7[1];
        *plVar7 = (long)psVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_4a8);
        puVar12 = (ulong *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_4f0.field_2._M_allocated_capacity = *puVar12;
          local_4f0.field_2._8_8_ = plVar7[3];
          local_4f0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_4f0.field_2._M_allocated_capacity = *puVar12;
          local_4f0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_4f0._M_string_length = plVar7[1];
        *plVar7 = (long)puVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        GenCreateParam_abi_cxx11_(&local_458,local_488,pFVar13);
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f0._M_dataplus._M_p != paVar1) {
          uVar15 = local_4f0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < local_458._M_string_length + local_4f0._M_string_length) {
          uVar15 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != &local_458.field_2) {
            uVar15 = local_458.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < local_458._M_string_length + local_4f0._M_string_length)
          goto LAB_0016e361;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_458,0,(char *)0x0,(ulong)local_4f0._M_dataplus._M_p);
        }
        else {
LAB_0016e361:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_4f0,(ulong)local_458._M_dataplus._M_p);
        }
        psVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_4c8.field_2._M_allocated_capacity = *psVar11;
          local_4c8.field_2._8_8_ = puVar8[3];
          local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
        }
        else {
          local_4c8.field_2._M_allocated_capacity = *psVar11;
          local_4c8._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_4c8._M_string_length = puVar8[1];
        *puVar8 = psVar11;
        puVar8[1] = 0;
        *(undefined1 *)psVar11 = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_4c8);
        psVar11 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_3f0.field_2._M_allocated_capacity = *psVar11;
          local_3f0.field_2._8_8_ = plVar7[3];
          local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
        }
        else {
          local_3f0.field_2._M_allocated_capacity = *psVar11;
          local_3f0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_3f0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        CodeWriter::operator+=(local_4d0,&local_3f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
          operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
          operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f0._M_dataplus._M_p != paVar1) {
          operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
          operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_dataplus._M_p != &local_480.field_2) {
          operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
        }
        ppFVar9 = (local_438->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppFVar14 = ppFVar14 + 1;
    } while (ppFVar14 != ppFVar9);
  }
  pSVar4 = local_438;
  this_00 = (local_438->super_Definition).defined_namespace;
  local_4f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"Create","");
  Namespace::GetFullyQualifiedName(&local_4c8,this_00,&local_4f0,1000);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  local_4f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"CREATE_NAME","");
  TranslateNameSpace(&local_4a8,&local_4c8);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&local_4d0->value_map_,&local_4f0);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_290,"  return {{CREATE_NAME}}{{STRUCT_NAME}}(","");
  CodeWriter::operator+=(local_4d0,&local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"      _fbb\\","");
  CodeWriter::operator+=(local_4d0,&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  ppFVar14 = (pSVar4->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppFVar9 = (pSVar4->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar14 != ppFVar9) {
    do {
      pFVar13 = *ppFVar14;
      if (pFVar13->deprecated == false) {
        if (((pFVar13->value).type.base_type == BASE_TYPE_STRUCT) &&
           (pSVar4 = (pFVar13->value).type.struct_def, pSVar4->fixed == true)) {
          local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"native_type","");
          cVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                           *)&(pSVar4->super_Definition).attributes,&local_4f0);
          if ((_Rb_tree_header *)cVar10._M_node ==
              &(pSVar4->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
            bVar17 = true;
          }
          else {
            bVar17 = *(long *)(cVar10._M_node + 2) == 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
            operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
          }
          pFVar13 = *ppFVar14;
          if (bVar17) goto LAB_0016e764;
          Name_abi_cxx11_(&local_4a8,local_488,pFVar13);
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_4a8,0,(char *)0x0,0x362229);
          local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
          puVar12 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_4f0.field_2._M_allocated_capacity = *puVar12;
            local_4f0.field_2._8_8_ = puVar8[3];
          }
          else {
            local_4f0.field_2._M_allocated_capacity = *puVar12;
            local_4f0._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_4f0._M_string_length = puVar8[1];
          *puVar8 = puVar12;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_4f0);
          local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
          psVar11 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_430.field_2._M_allocated_capacity = *psVar11;
            local_430.field_2._8_8_ = plVar7[3];
          }
          else {
            local_430.field_2._M_allocated_capacity = *psVar11;
            local_430._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_430._M_string_length = plVar7[1];
          *plVar7 = (long)psVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          CodeWriter::operator+=(local_4d0,&local_430);
          uVar15 = local_430.field_2._M_allocated_capacity;
          _Var16._M_p = local_430._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_430._M_dataplus._M_p != &local_430.field_2) goto LAB_0016e853;
        }
        else {
LAB_0016e764:
          Name_abi_cxx11_(&local_4a8,local_488,pFVar13);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_4a8,0,(char *)0x0,0x362234);
          local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
          puVar12 = (ulong *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_4f0.field_2._M_allocated_capacity = *puVar12;
            local_4f0.field_2._8_8_ = plVar7[3];
          }
          else {
            local_4f0.field_2._M_allocated_capacity = *puVar12;
            local_4f0._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_4f0._M_string_length = plVar7[1];
          *plVar7 = (long)puVar12;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_4f0);
          psVar11 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_410.field_2._M_allocated_capacity = *psVar11;
            local_410.field_2._8_8_ = plVar7[3];
            local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar11;
            local_410._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_410._M_string_length = plVar7[1];
          *plVar7 = (long)psVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          CodeWriter::operator+=(local_4d0,&local_410);
          uVar15 = local_410.field_2._M_allocated_capacity;
          _Var16._M_p = local_410._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
LAB_0016e853:
            operator_delete(_Var16._M_p,uVar15 + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
          operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
          operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
        }
      }
      ppFVar14 = ppFVar14 + 1;
    } while (ppFVar14 != ppFVar9);
  }
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,");","");
  CodeWriter::operator+=(local_4d0,&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"}","");
  CodeWriter::operator+=(local_4d0,&local_2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"");
  CodeWriter::operator+=(local_4d0,&local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenTablePost(const StructDef &struct_def) {
    if (opts_.generate_object_based_api) { GenNativeTablePost(struct_def); }

    code_.SetValue("STRUCT_NAME", Name(struct_def));
    code_.SetValue("NATIVE_NAME",
                   NativeName(Name(struct_def), &struct_def, opts_));

    if (opts_.generate_object_based_api) {
      // Generate the >= C++11 copy ctor and assignment operator definitions.
      GenCopyCtorAssignOpDefs(struct_def);

      // Generate the X::UnPack() method.
      code_ +=
          "inline " + TableUnPackSignature(struct_def, false, opts_) + " {";

      if (opts_.g_cpp_std == cpp::CPP_STD_X0) {
        auto native_name = WrapNativeNameInNameSpace(struct_def, parser_.opts);
        code_.SetValue("POINTER_TYPE",
                       GenTypeNativePtr(native_name, nullptr, false));
        code_ +=
            "  {{POINTER_TYPE}} _o = {{POINTER_TYPE}}(new {{NATIVE_NAME}}());";
      } else if (opts_.g_cpp_std == cpp::CPP_STD_11) {
        code_ +=
            "  auto _o = std::unique_ptr<{{NATIVE_NAME}}>(new "
            "{{NATIVE_NAME}}());";
      } else {
        code_ += "  auto _o = std::make_unique<{{NATIVE_NAME}}>();";
      }
      code_ += "  UnPackTo(_o.get(), _resolver);";
      code_ += "  return _o.release();";
      code_ += "}";
      code_ += "";
      code_ +=
          "inline " + TableUnPackToSignature(struct_def, false, opts_) + " {";
      code_ += "  (void)_o;";
      code_ += "  (void)_resolver;";

      for (auto it = struct_def.fields.vec.begin();
           it != struct_def.fields.vec.end(); ++it) {
        const auto &field = **it;
        if (field.deprecated) { continue; }

        // Assign a value from |this| to |_o|.   Values from |this| are stored
        // in a variable |_e| by calling this->field_type().  The value is then
        // assigned to |_o| using the GenUnpackFieldStatement.
        const bool is_union = field.value.type.base_type == BASE_TYPE_UTYPE;
        const auto statement =
            GenUnpackFieldStatement(field, is_union ? *(it + 1) : nullptr);

        code_.SetValue("FIELD_NAME", Name(field));
        auto prefix = "  { auto _e = {{FIELD_NAME}}(); ";
        auto check = IsScalar(field.value.type.base_type) ? "" : "if (_e) ";
        auto postfix = " }";
        code_ += std::string(prefix) + check + statement + postfix;
      }
      code_ += "}";
      code_ += "";

      // Generate the X::Pack member function that simply calls the global
      // CreateX function.
      code_ += "inline " + TablePackSignature(struct_def, false, opts_) + " {";
      code_ += "  return Create{{STRUCT_NAME}}(_fbb, _o, _rehasher);";
      code_ += "}";
      code_ += "";

      // Generate a CreateX method that works with an unpacked C++ object.
      code_ +=
          "inline " + TableCreateSignature(struct_def, false, opts_) + " {";
      code_ += "  (void)_rehasher;";
      code_ += "  (void)_o;";

      code_ +=
          "  struct _VectorArgs "
          "{ " +
          GetBuilder() +
          " *__fbb; "
          "const " +
          NativeName(Name(struct_def), &struct_def, opts_) +
          "* __o; "
          "const ::flatbuffers::rehasher_function_t *__rehasher; } _va = { "
          "&_fbb, _o, _rehasher}; (void)_va;";

      for (auto it = struct_def.fields.vec.begin();
           it != struct_def.fields.vec.end(); ++it) {
        auto &field = **it;
        if (field.deprecated) { continue; }
        if (IsVector(field.value.type)) {
          const std::string force_align_code =
              GenVectorForceAlign(field, "_o->" + Name(field) + ".size()");
          if (!force_align_code.empty()) { code_ += "  " + force_align_code; }
        }
        code_ += "  auto _" + Name(field) + " = " + GenCreateParam(field) + ";";
      }
      // Need to call "Create" with the struct namespace.
      const auto qualified_create_name =
          struct_def.defined_namespace->GetFullyQualifiedName("Create");
      code_.SetValue("CREATE_NAME", TranslateNameSpace(qualified_create_name));

      code_ += "  return {{CREATE_NAME}}{{STRUCT_NAME}}(";
      code_ += "      _fbb\\";
      for (const auto &field : struct_def.fields.vec) {
        if (field->deprecated) { continue; }

        bool pass_by_address = false;
        if (field->value.type.base_type == BASE_TYPE_STRUCT) {
          if (IsStruct(field->value.type)) {
            auto native_type =
                field->value.type.struct_def->attributes.Lookup("native_type");
            if (native_type) { pass_by_address = true; }
          }
        }

        // Call the CreateX function using values from |_o|.
        if (pass_by_address) {
          code_ += ",\n      &_" + Name(*field) + "\\";
        } else {
          code_ += ",\n      _" + Name(*field) + "\\";
        }
      }
      code_ += ");";
      code_ += "}";
      code_ += "";
    }
  }